

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  Op *local_28;
  Op *pOp;
  int nOp_local;
  Op *aOp_local;
  sqlite3 *db_local;
  
  if (aOp != (Op *)0x0) {
    for (local_28 = aOp + (nOp + -1); aOp <= local_28; local_28 = local_28 + -1) {
      if (local_28->p4type < -6) {
        freeP4(db,(int)local_28->p4type,(local_28->p4).p);
      }
    }
    sqlite3DbFreeNN(db,aOp);
  }
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  if( aOp ){
    Op *pOp;
    for(pOp=&aOp[nOp-1]; pOp>=aOp; pOp--){
      if( pOp->p4type <= P4_FREE_IF_LE ) freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif     
    }
    sqlite3DbFreeNN(db, aOp);
  }
}